

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O1

ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer *buffer,ZyanString **string)

{
  ZyanStatus ZVar1;
  
  ZVar1 = 0x80100004;
  if (string != (ZyanString **)0x0 && buffer != (ZydisFormatterBuffer *)0x0) {
    if ((buffer->is_token_list == '\0') ||
       (*(char *)((long)(buffer->string).vector.data + -2) != '\0')) {
      if ((buffer->string).vector.data == (void *)0x0) {
        __assert_fail("buffer->string.vector.data",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBuffer.c"
                      ,0x67,
                      "ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer *, ZyanString **)"
                     );
      }
      if ((buffer->string).vector.size == 0) {
        __assert_fail("buffer->string.vector.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBuffer.c"
                      ,0x68,
                      "ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer *, ZyanString **)"
                     );
      }
      *string = &buffer->string;
      ZVar1 = 0x100000;
    }
    else {
      ZVar1 = 0x80100005;
    }
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisFormatterBufferGetString(ZydisFormatterBuffer* buffer, ZyanString** string)
{
    if (!buffer || !string)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (buffer->is_token_list &&
        ((ZydisFormatterTokenConst*)buffer->string.vector.data - 1)->type == ZYDIS_TOKEN_INVALID)
    {
        return ZYAN_STATUS_INVALID_OPERATION;
    }

    ZYAN_ASSERT(buffer->string.vector.data);
    ZYAN_ASSERT(buffer->string.vector.size);

    *string = &buffer->string;

    return ZYAN_STATUS_SUCCESS;
}